

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall CaDiCaL::Solver::transition_to_steady_state(Solver *this)

{
  State *pSVar1;
  External *in_RDI;
  Internal *in_stack_00000030;
  
  pSVar1 = state((Solver *)in_RDI);
  if (*pSVar1 == CONFIGURING) {
    if ((((*(Internal **)&in_RDI->max_var)->opts).check != 0) &&
       (((*(Internal **)&in_RDI->max_var)->opts).checkproof != 0)) {
      Internal::check(in_stack_00000030);
    }
  }
  else {
    pSVar1 = state((Solver *)in_RDI);
    if (*pSVar1 == SATISFIED) {
      External::reset_assumptions(in_RDI);
      External::reset_concluded((External *)0xe1eec7);
      External::reset_constraint(in_RDI);
    }
    else {
      pSVar1 = state((Solver *)in_RDI);
      if (*pSVar1 == UNSATISFIED) {
        External::reset_assumptions(in_RDI);
        External::reset_concluded((External *)0xe1ef06);
        External::reset_constraint(in_RDI);
      }
    }
  }
  pSVar1 = state((Solver *)in_RDI);
  if ((*pSVar1 != STEADY) && (*(int *)((long)&in_RDI->internal + 4) != 4)) {
    *(undefined4 *)((long)&in_RDI->internal + 4) = 4;
  }
  return;
}

Assistant:

void Solver::transition_to_steady_state () {
  if (state () == CONFIGURING) {
    LOG ("API leaves state %sCONFIGURING%s", tout.emph_code (),
         tout.normal_code ());
    if (internal->opts.check && internal->opts.checkproof) {
      internal->check ();
    }
  } else if (state () == SATISFIED) {
    LOG ("API leaves state %sSATISFIED%s", tout.emph_code (),
         tout.normal_code ());
    external->reset_assumptions ();
    external->reset_concluded ();
    external->reset_constraint ();
  } else if (state () == UNSATISFIED) {
    LOG ("API leaves state %sUNSATISFIED%s", tout.emph_code (),
         tout.normal_code ());
    external->reset_assumptions ();
    external->reset_concluded ();
    external->reset_constraint ();
  }
  if (state () != STEADY)
    STATE (STEADY);
}